

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_modules.cpp
# Opt level: O2

void module_with_dependent_async_launch(uint W)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *pNVar4;
  code *pcVar5;
  double dVar6;
  FlowBuilder FVar7;
  FlowBuilder FVar8;
  char extraout_AL;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  Task D;
  Task C;
  Task B;
  int cnt;
  Task E;
  _Tuple_impl<0UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&> local_3e8;
  Task A;
  Task m1_1;
  int local_3ac;
  shared_ptr<tf::WorkerInterface> local_3a8;
  ResultBuilder DOCTEST_RB;
  pair<tf::AsyncTask,_std::future<void>_> local_320;
  Taskflow f1;
  int *local_240;
  undefined4 local_238;
  Taskflow f0;
  Executor executor;
  
  local_3a8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_3a8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)W,&local_3a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_3a8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  tf::Taskflow::Taskflow(&f0);
  FVar7 = f0.super_FlowBuilder;
  cnt = 0;
  f1.super_FlowBuilder._graph = (Graph *)operator_new(0xd8);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 1);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[1].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  f1.super_FlowBuilder._graph[1].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&f1.super_FlowBuilder._graph[5].
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&cnt;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:598:23)>
                ::_M_invoke;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:598:23)>
                ::_M_manager;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[8].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 1;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar7._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  FVar8 = f0.super_FlowBuilder;
  A._node = ((FVar7._graph)->
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ).
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
            super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
            super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  f1.super_FlowBuilder._graph = (Graph *)operator_new(0xd8);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 1);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[1].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  f1.super_FlowBuilder._graph[1].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&f1.super_FlowBuilder._graph[5].
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&cnt;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:599:23)>
                ::_M_invoke;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:599:23)>
                ::_M_manager;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[8].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 1;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar8._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  FVar7 = f0.super_FlowBuilder;
  B._node = ((FVar8._graph)->
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ).
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
            super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
            super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  f1.super_FlowBuilder._graph = (Graph *)operator_new(0xd8);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 1);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[1].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  f1.super_FlowBuilder._graph[1].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&f1.super_FlowBuilder._graph[5].
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&cnt;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:600:23)>
                ::_M_invoke;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:600:23)>
                ::_M_manager;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[8].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 1;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar7._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  FVar8 = f0.super_FlowBuilder;
  C._node = ((FVar7._graph)->
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ).
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
            super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
            super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  f1.super_FlowBuilder._graph = (Graph *)operator_new(0xd8);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 1);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[1].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  f1.super_FlowBuilder._graph[1].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&f1.super_FlowBuilder._graph[5].
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&cnt;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:601:23)>
                ::_M_invoke;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:601:23)>
                ::_M_manager;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[8].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 1;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar8._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  D._node = ((FVar8._graph)->
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ).
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
            super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
            super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  f1.super_FlowBuilder._graph = (Graph *)operator_new(0xd8);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 1);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[1].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  f1.super_FlowBuilder._graph[1].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&f1.super_FlowBuilder._graph[5].
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&cnt;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:602:23)>
                ::_M_invoke;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:602:23)>
                ::_M_manager;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[8].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 1;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)f0.super_FlowBuilder._graph,
             (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  E._node = ((f0.super_FlowBuilder._graph)->
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ).
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
            super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
            super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  tf::Node::_precede(A._node,B._node);
  tf::Node::_precede(B._node,C._node);
  tf::Node::_precede(C._node,D._node);
  tf::Node::_precede(D._node,E._node);
  tf::Taskflow::Taskflow(&f1);
  FVar7 = f1.super_FlowBuilder;
  local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl =
       (_Head_base<4UL,_tf::Task_&,_false>)operator_new(0xd8);
  ((Task *)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
           super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
           super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
           super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl)->_node = (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 8))->_node =
       (Node *)((long)local_3e8.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x18);
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x10))->_node =
       (Node *)0x0;
  *(undefined1 *)
   &((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>
                    .super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                    _M_head_impl + 0x18))->_node = 0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x28))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x30))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x38))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x40))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x48))->_node =
       (Node *)((long)local_3e8.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x60);
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x50))->_node =
       (Node *)((long)local_3e8.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x60);
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x58))->_node =
       (Node *)((long)local_3e8.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x80);
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x80))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x90))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x88))->_node =
       (Node *)&cnt;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0xa0))->_node =
       (Node *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:613:5)>
               ::_M_invoke;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x98))->_node =
       (Node *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:613:5)>
               ::_M_manager;
  *(undefined1 *)
   &((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>
                    .super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                    _M_head_impl + 0xc0))->_node = 1;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 200))->_node = (Node *)0x0
  ;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0xd0))->_node =
       (Node *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar7._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_3e8);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_3e8);
  FVar8 = f1.super_FlowBuilder;
  pNVar1 = ((FVar7._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl =
       (_Head_base<4UL,_tf::Task_&,_false>)operator_new(0xd8);
  ((Task *)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
           super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
           super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
           super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl)->_node = (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 8))->_node =
       (Node *)((long)local_3e8.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x18);
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x10))->_node =
       (Node *)0x0;
  *(undefined1 *)
   &((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>
                    .super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                    _M_head_impl + 0x18))->_node = 0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x28))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x30))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x38))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x40))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x48))->_node =
       (Node *)((long)local_3e8.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x60);
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x50))->_node =
       (Node *)((long)local_3e8.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x60);
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x58))->_node =
       (Node *)((long)local_3e8.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x80);
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x80))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x90))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x88))->_node =
       (Node *)&cnt;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0xa0))->_node =
       (Node *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:614:5)>
               ::_M_invoke;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x98))->_node =
       (Node *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:614:5)>
               ::_M_manager;
  *(undefined1 *)
   &((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>
                    .super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                    _M_head_impl + 0xc0))->_node = 1;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 200))->_node = (Node *)0x0
  ;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0xd0))->_node =
       (Node *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar8._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_3e8);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_3e8);
  FVar7 = f1.super_FlowBuilder;
  pNVar2 = ((FVar8._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl =
       (_Head_base<4UL,_tf::Task_&,_false>)operator_new(0xd8);
  ((Task *)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
           super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
           super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
           super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl)->_node = (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 8))->_node =
       (Node *)((long)local_3e8.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x18);
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x10))->_node =
       (Node *)0x0;
  *(undefined1 *)
   &((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>
                    .super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                    _M_head_impl + 0x18))->_node = 0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x28))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x30))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x38))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x40))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x48))->_node =
       (Node *)((long)local_3e8.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x60);
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x50))->_node =
       (Node *)((long)local_3e8.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x60);
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x58))->_node =
       (Node *)((long)local_3e8.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x80);
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x80))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x90))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x88))->_node =
       (Node *)&cnt;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0xa0))->_node =
       (Node *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:615:5)>
               ::_M_invoke;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x98))->_node =
       (Node *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:615:5)>
               ::_M_manager;
  *(undefined1 *)
   &((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>
                    .super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                    _M_head_impl + 0xc0))->_node = 1;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 200))->_node = (Node *)0x0
  ;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0xd0))->_node =
       (Node *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar7._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_3e8);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_3e8);
  FVar8 = f1.super_FlowBuilder;
  pNVar3 = ((FVar7._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl =
       (_Head_base<4UL,_tf::Task_&,_false>)operator_new(0xd8);
  ((Task *)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
           super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
           super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
           super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl)->_node = (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 8))->_node =
       (Node *)((long)local_3e8.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x18);
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x10))->_node =
       (Node *)0x0;
  *(undefined1 *)
   &((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>
                    .super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                    _M_head_impl + 0x18))->_node = 0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x28))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x30))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x38))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x40))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x48))->_node =
       (Node *)((long)local_3e8.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x60);
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x50))->_node =
       (Node *)((long)local_3e8.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x60);
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x58))->_node =
       (Node *)((long)local_3e8.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x80);
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x80))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x90))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x88))->_node =
       (Node *)&cnt;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0xa0))->_node =
       (Node *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:616:5)>
               ::_M_invoke;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x98))->_node =
       (Node *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:616:5)>
               ::_M_manager;
  *(undefined1 *)
   &((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>
                    .super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                    _M_head_impl + 0xc0))->_node = 1;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 200))->_node = (Node *)0x0
  ;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0xd0))->_node =
       (Node *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar8._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_3e8);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_3e8);
  FVar7 = f1.super_FlowBuilder;
  pNVar4 = ((FVar8._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl =
       (_Head_base<4UL,_tf::Task_&,_false>)operator_new(0xd8);
  ((Task *)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
           super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
           super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
           super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl)->_node = (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 8))->_node =
       (Node *)((long)local_3e8.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x18);
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x10))->_node =
       (Node *)0x0;
  *(undefined1 *)
   &((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>
                    .super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                    _M_head_impl + 0x18))->_node = 0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x28))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x30))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x38))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x40))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x48))->_node =
       (Node *)((long)local_3e8.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x60);
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x50))->_node =
       (Node *)((long)local_3e8.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x60);
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x58))->_node =
       (Node *)((long)local_3e8.
                      super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                      super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                      _M_head_impl + 0x80);
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x80))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x90))->_node =
       (Node *)0x0;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x88))->_node =
       (Node *)&cnt;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0xa0))->_node =
       (Node *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:617:5)>
               ::_M_invoke;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0x98))->_node =
       (Node *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:617:5)>
               ::_M_manager;
  *(undefined1 *)
   &((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>
                    .super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
                    super__Tuple_impl<4UL,_tf::Task_&>.super__Head_base<4UL,_tf::Task_&,_false>.
                    _M_head_impl + 0xc0))->_node = 1;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 200))->_node = (Node *)0x0
  ;
  ((Task *)((long)local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
                  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
                  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl + 0xd0))->_node =
       (Node *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar7._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_3e8);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_3e8);
  DOCTEST_RB.super_AssertData.m_test_case =
       (TestCaseData *)
       ((FVar7._graph)->
       super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ).
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Tuple_impl<4UL,_tf::Task_&>.
  super__Head_base<4UL,_tf::Task_&,_false>._M_head_impl = (_Head_base<4UL,_tf::Task_&,_false>)&E;
  local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.super__Head_base<3UL,_tf::Task_&,_false>.
  _M_head_impl = &D;
  local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Head_base<2UL,_tf::Task_&,_false>._M_head_impl = &C;
  local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
  super__Head_base<1UL,_tf::Task_&,_false>._M_head_impl = &B;
  local_3e8.super__Head_base<0UL,_tf::Task_&,_false>._M_head_impl = &A;
  DOCTEST_RB.super_AssertData._8_8_ = pNVar4;
  DOCTEST_RB.super_AssertData.m_file = (char *)pNVar3;
  DOCTEST_RB.super_AssertData._24_8_ = pNVar2;
  DOCTEST_RB.super_AssertData.m_expr = (char *)pNVar1;
  std::_Tuple_impl<0ul,tf::Task&,tf::Task&,tf::Task&,tf::Task&,tf::Task&>::
  _M_assign<tf::Task,tf::Task,tf::Task,tf::Task,tf::Task>
            (&local_3e8,
             (_Tuple_impl<0UL,_tf::Task,_tf::Task,_tf::Task,_tf::Task,_tf::Task> *)&DOCTEST_RB);
  tf::Node::_precede(A._node,B._node);
  tf::Node::_precede(B._node,C._node);
  tf::Node::_precede(C._node,D._node);
  tf::Node::_precede(D._node,E._node);
  tf::FlowBuilder::composed_of<tf::Taskflow>((FlowBuilder *)&m1_1,&f1);
  tf::Node::_precede(E._node,m1_1._node);
  DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)&f1;
  tf::Executor::
  dependent_async<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_taskflow_algorithm_module_hpp:14:10),_nullptr>
            (&local_320,&executor,(anon_class_8_1_6ca262cf *)&DOCTEST_RB);
  std::future<void>::get(&local_320.second);
  DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
  DOCTEST_RB.super_AssertData._71_2_ = 0x17;
  DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_238 = 0xc;
  DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
  DOCTEST_RB.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp"
  ;
  DOCTEST_RB.super_AssertData.m_line = 0x276;
  DOCTEST_RB.super_AssertData.m_expr = "cnt == 10";
  DOCTEST_RB.super_AssertData.m_failed = true;
  DOCTEST_RB.super_AssertData.m_threw = false;
  DOCTEST_RB.super_AssertData.m_threw_as = false;
  DOCTEST_RB.super_AssertData.m_exception_type = "";
  DOCTEST_RB.super_AssertData.m_exception_string = "";
  local_3ac = 10;
  local_240 = &cnt;
  doctest::detail::Expression_lhs<int_const&>::operator==
            ((Result *)&local_3e8,(Expression_lhs<int_const&> *)&local_240,&local_3ac);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,(Result *)&local_3e8);
  doctest::String::~String
            ((String *)
             &local_3e8.super__Tuple_impl<1UL,_tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
              super__Tuple_impl<2UL,_tf::Task_&,_tf::Task_&,_tf::Task_&>.
              super__Tuple_impl<3UL,_tf::Task_&,_tf::Task_&>.
              super__Head_base<3UL,_tf::Task_&,_false>);
  dVar6 = doctest::detail::ResultBuilder::log
                    (&DOCTEST_RB,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  if (extraout_AL != '\0') {
    pcVar5 = (code *)swi(3);
    (*pcVar5)(SUB84(dVar6,0));
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
  std::pair<tf::AsyncTask,_std::future<void>_>::~pair(&local_320);
  tf::Taskflow::~Taskflow(&f1);
  tf::Taskflow::~Taskflow(&f0);
  tf::Executor::~Executor(&executor);
  return;
}

Assistant:

void module_with_dependent_async_launch(unsigned W) {

  tf::Executor executor(W);

  tf::Taskflow f0;

  int cnt {0};

  auto A = f0.emplace([&cnt](){ ++cnt; });
  auto B = f0.emplace([&cnt](){ ++cnt; });
  auto C = f0.emplace([&cnt](){ ++cnt; });
  auto D = f0.emplace([&cnt](){ ++cnt; });
  auto E = f0.emplace([&cnt](){ ++cnt; });

  A.precede(B);
  B.precede(C);
  C.precede(D);
  D.precede(E);

  tf::Taskflow f1;

  // module 1
  std::tie(A, B, C, D, E) = f1.emplace(
    [&cnt] () { ++cnt; },
    [&cnt] () { ++cnt; },
    [&cnt] () { ++cnt; },
    [&cnt] () { ++cnt; },
    [&cnt] () { ++cnt; }
  );
  A.precede(B);
  B.precede(C);
  C.precede(D);
  D.precede(E);
  auto m1_1 = f1.composed_of(f0);
  E.precede(m1_1);

  auto [task, future] = executor.dependent_async(tf::make_module_task(f1)); 

  future.get();

  REQUIRE(cnt == 10);
}